

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QHttpPartPrivate>::reset
          (QSharedDataPointer<QHttpPartPrivate> *this,QHttpPartPrivate *ptr)

{
  bool bVar1;
  QHttpPartPrivate *pQVar2;
  QHttpPartPrivate *in_RSI;
  QHttpPartPrivate *in_RDI;
  long in_FS_OFFSET;
  QHttpPartPrivate *old;
  totally_ordered_wrapper<QHttpPartPrivate_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QHttpPartPrivate_*> local_18;
  totally_ordered_wrapper<QHttpPartPrivate_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::get
                     ((totally_ordered_wrapper<QHttpPartPrivate_*> *)in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QHttpPartPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2e67ac);
    }
    Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::totally_ordered_wrapper(&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QHttpPartPrivate*>,Qt::totally_ordered_wrapper<QHttpPartPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QHttpPartPrivate_*> *)0x2e67ca);
    pQVar2 = Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::get(&local_10);
    if (((pQVar2 != (QHttpPartPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2e67f0), !bVar1)) &&
       (pQVar2 != (QHttpPartPrivate *)0x0)) {
      QHttpPartPrivate::~QHttpPartPrivate(in_RDI);
      operator_delete(pQVar2,0x98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }